

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_symbol
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *content,nk_flags state,
               nk_style_button *style,nk_symbol_type type,nk_user_font *font)

{
  nk_style_item *pnVar1;
  nk_style_item *background;
  nk_color local_38;
  nk_color bg;
  nk_color sym;
  nk_symbol_type type_local;
  nk_style_button *style_local;
  nk_flags state_local;
  nk_rect *content_local;
  nk_rect *bounds_local;
  nk_command_buffer *out_local;
  
  pnVar1 = nk_draw_button(out,bounds,state,style);
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    background._4_4_ = (pnVar1->data).color;
  }
  else {
    background._4_4_ = style->text_background;
  }
  if ((state & 0x10) == 0) {
    if ((state & 0x20) == 0) {
      local_38 = style->text_normal;
    }
    else {
      local_38 = style->text_active;
    }
  }
  else {
    local_38 = style->text_hover;
  }
  nk_draw_symbol(out,type,*content,background._4_4_,local_38,1.0,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_symbol(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *content,
    nk_flags state, const struct nk_style_button *style,
    enum nk_symbol_type type, const struct nk_user_font *font)
{
    struct nk_color sym, bg;
    const struct nk_style_item *background;

    /* select correct colors/images */
    background = nk_draw_button(out, bounds, state, style);
    if (background->type == NK_STYLE_ITEM_COLOR)
        bg = background->data.color;
    else bg = style->text_background;

    if (state & NK_WIDGET_STATE_HOVER)
        sym = style->text_hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        sym = style->text_active;
    else sym = style->text_normal;
    nk_draw_symbol(out, type, *content, bg, sym, 1, font);
}